

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void mean_int_2_suite::test_same(void)

{
  moment<int,_2> filter;
  size_type local_68;
  uint local_5c;
  basic_moment<int,_2UL,_(trial::online::with)1> local_58;
  
  local_58.member.window.super_span<int,_2UL>.member.size = 0;
  local_58.member.window.super_span<int,_2UL>.member.next = 2;
  local_58.member.mean = 0;
  local_58.member.window.super_span<int,_2UL>.member.data = (pointer)&local_58;
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::push(&local_58,1);
  local_68 = local_58.member.window.super_span<int,_2UL>.member.size;
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1a2,"void mean_int_2_suite::test_same()",&local_68,&local_5c);
  local_68 = CONCAT44(local_68._4_4_,local_58.member.mean);
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("filter.mean()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1a3,"void mean_int_2_suite::test_same()",&local_68,&local_5c);
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::push(&local_58,1);
  local_68 = local_58.member.window.super_span<int,_2UL>.member.size;
  local_5c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1a5,"void mean_int_2_suite::test_same()",&local_68,&local_5c);
  local_68 = CONCAT44(local_68._4_4_,local_58.member.mean);
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("filter.mean()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1a6,"void mean_int_2_suite::test_same()",&local_68,&local_5c);
  trial::online::window::basic_moment<int,_2UL,_(trial::online::with)1>::push(&local_58,1);
  local_5c = local_5c & 0xffffff00;
  local_68._0_1_ = local_58.member.window.super_span<int,_2UL>.member.size == 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1a8,"void mean_int_2_suite::test_same()",&local_68,&local_5c);
  local_68 = CONCAT71(local_68._1_7_,local_58.member.window.super_span<int,_2UL>.member.size == 2);
  local_5c = CONCAT31(local_5c._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","true",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1a9,"void mean_int_2_suite::test_same()",&local_68,&local_5c);
  local_68 = local_58.member.window.super_span<int,_2UL>.member.size;
  local_5c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1aa,"void mean_int_2_suite::test_same()",&local_68,&local_5c);
  local_68 = CONCAT44(local_68._4_4_,local_58.member.mean);
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("filter.mean()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1ab,"void mean_int_2_suite::test_same()",&local_68,&local_5c);
  return;
}

Assistant:

void test_same()
{
    window::moment<int, 2> filter;
    filter.push(1);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 1);
    filter.push(1);
    TRIAL_TEST_EQ(filter.size(), 2);
    TRIAL_TEST_EQ(filter.mean(), 1);
    filter.push(1);
    TRIAL_TEST_EQ(filter.empty(), false);
    TRIAL_TEST_EQ(filter.full(), true);
    TRIAL_TEST_EQ(filter.size(), 2);
    TRIAL_TEST_EQ(filter.mean(), 1);
}